

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

void __thiscall QMainWindow::setCentralWidget(QMainWindow *this,QWidget *widget)

{
  QMainWindowPrivate *widget_00;
  QWidget *pQVar1;
  QMainWindowLayout *pQVar2;
  QMainWindowLayout *in_RSI;
  QMainWindowPrivate *d;
  
  widget_00 = d_func((QMainWindow *)0x5e963c);
  QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5e9650);
  pQVar1 = QMainWindowLayout::centralWidget((QMainWindowLayout *)0x5e9658);
  if (pQVar1 != (QWidget *)0x0) {
    QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5e966e);
    pQVar2 = (QMainWindowLayout *)QMainWindowLayout::centralWidget((QMainWindowLayout *)0x5e9676);
    if (pQVar2 != in_RSI) {
      QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5e968d);
      QMainWindowLayout::centralWidget((QMainWindowLayout *)0x5e9695);
      QWidget::hide((QWidget *)0x5e969d);
      QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5e96ad);
      QMainWindowLayout::centralWidget((QMainWindowLayout *)0x5e96b5);
      QObject::deleteLater();
    }
  }
  QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5e96cd);
  QMainWindowLayout::setCentralWidget(in_RSI,(QWidget *)widget_00);
  return;
}

Assistant:

void QMainWindow::setCentralWidget(QWidget *widget)
{
    Q_D(QMainWindow);
    if (d->layout->centralWidget() && d->layout->centralWidget() != widget) {
        d->layout->centralWidget()->hide();
        d->layout->centralWidget()->deleteLater();
    }
    d->layout->setCentralWidget(widget);
}